

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
TestWriterTestdropNullPlaceholders::runTestCase(TestWriterTestdropNullPlaceholders *this)

{
  int iVar1;
  char *in_RCX;
  Value nullValue;
  FastWriter writer;
  undefined1 local_98 [72];
  FastWriter local_50;
  
  Json::FastWriter::FastWriter(&local_50);
  Json::Value::Value((Value *)(local_98 + 0x20),nullValue);
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)local_98,(int)&local_50,local_98 + 0x20,(size_t)in_RCX);
  iVar1 = std::__cxx11::string::compare(local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_);
  }
  if (iVar1 != 0) {
    in_RCX = "writer.write(nullValue) == \"null\\n\"";
    JsonTest::TestResult::addFailure
              ((this->super_WriterTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x66d,"writer.write(nullValue) == \"null\\n\"");
  }
  Json::FastWriter::dropNullPlaceholders(&local_50);
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)local_98,(int)&local_50,local_98 + 0x20,(size_t)in_RCX);
  iVar1 = std::__cxx11::string::compare(local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_);
  }
  if (iVar1 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_WriterTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x670,"writer.write(nullValue) == \"\\n\"");
  }
  Json::Value::~Value((Value *)(local_98 + 0x20));
  Json::FastWriter::~FastWriter(&local_50);
  return;
}

Assistant:

JSONTEST_FIXTURE(WriterTest, dropNullPlaceholders) {
  Json::FastWriter writer;
  Json::Value nullValue;
  JSONTEST_ASSERT(writer.write(nullValue) == "null\n");

  writer.dropNullPlaceholders();
  JSONTEST_ASSERT(writer.write(nullValue) == "\n");
}